

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall kj::Path::validatePart(Path *this,StringPtr part)

{
  char cVar1;
  bool bVar2;
  bool _kjCondition;
  Fault f_1;
  StringPtr part_local;
  Fault f;
  char local_48;
  StringPtr *local_38;
  ArrayPtr<const_char> local_30;
  
  part_local.content.size_ = (size_t)part.content.ptr;
  part_local.content.ptr = (char *)this;
  local_38 = &part_local;
  kj::_::DebugExpression<kj::StringPtr&>::operator!=
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[1]> *)&f,
             (DebugExpression<kj::StringPtr&> *)&local_38,(char (*) [1])0x3fdd82);
  if (local_48 == '\x01') {
    f_1.exception = (Exception *)0x44c3f5;
    bVar2 = ArrayPtr<const_char>::operator==(&part_local.content,(ArrayPtr<const_char> *)&f_1);
    if (!bVar2) {
      local_30.ptr = "..";
      local_30.size_ = 3;
      bVar2 = ArrayPtr<const_char>::operator==(&part_local.content,&local_30);
      _kjCondition = !bVar2;
      if (!bVar2) {
        f.exception = (Exception *)strlen(part_local.content.ptr);
        if (f.exception != (Exception *)(part_local.content.size_ - 1)) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[32],kj::StringPtr&>
                    (&f_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x134,FAILED,"strlen(part.begin()) == part.size()",
                     "_kjCondition,\"NUL character in path component\", part",
                     (DebugComparison<unsigned_long,_unsigned_long> *)&f,
                     (char (*) [32])"NUL character in path component",
                     (StringPtr *)&part_local.content);
          kj::_::Debug::Fault::fatal(&f_1);
        }
        StringPtr::findFirst((StringPtr *)&f_1,(char)&part_local);
        cVar1 = (char)f_1.exception;
        if ((char)f_1.exception == '\x01') {
          f_1.exception = f_1.exception & 0xffffffffffffff00;
        }
        f.exception._0_1_ = cVar1;
        if (cVar1 == '\0') {
          return;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&,char_const(&)[68],kj::StringPtr&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x136,FAILED,"part.findFirst(\'/\') == kj::none",
                   "_kjCondition,\"\'/\' character in path component; did you mean to use Path::parse()?\", part"
                   ,(DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&f,
                   (char (*) [68])
                   "\'/\' character in path component; did you mean to use Path::parse()?",
                   &part_local);
        kj::_::Debug::Fault::fatal(&f_1);
      }
      goto LAB_003b05aa;
    }
  }
  _kjCondition = false;
LAB_003b05aa:
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[23],kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x133,FAILED,"part != \"\" && part != \".\" && part != \"..\"",
             "_kjCondition,\"invalid path component\", part",&_kjCondition,
             (char (*) [23])"invalid path component",&part_local);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void Path::validatePart(StringPtr part) {
  KJ_REQUIRE(part != "" && part != "." && part != "..", "invalid path component", part);
  KJ_REQUIRE(strlen(part.begin()) == part.size(), "NUL character in path component", part);
  KJ_REQUIRE(part.findFirst('/') == kj::none,
      "'/' character in path component; did you mean to use Path::parse()?", part);
}